

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_transpose(mat4 m)

{
  mat4 *in_RDI;
  
  in_RDI->m[0] = m.m[0];
  in_RDI->m[1] = m.m[4];
  in_RDI->m[2] = m.m[8];
  in_RDI->m[3] = m.m[0xc];
  in_RDI->m[4] = m.m[1];
  in_RDI->m[5] = m.m[5];
  in_RDI->m[6] = m.m[9];
  in_RDI->m[7] = m.m[0xd];
  in_RDI->m[8] = m.m[2];
  in_RDI->m[9] = m.m[6];
  in_RDI->m[10] = m.m[10];
  in_RDI->m[0xb] = m.m[0xe];
  in_RDI->m[0xc] = m.m[3];
  in_RDI->m[0xd] = m.m[7];
  in_RDI->m[0xe] = m.m[0xb];
  in_RDI->m[0xf] = m.m[0xf];
  return in_RDI;
}

Assistant:

mat4 mat4_transpose(mat4 m) {
    float *a = m.m;

    return mat4_create(
            a[0], a[4], a[8], a[12],
            a[1], a[5], a[9], a[13],
            a[2], a[6], a[10], a[14],
            a[3], a[7], a[11], a[15]);
}